

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int If_ManSatDeriveGiaFromBits
              (void *pGia,Ifn_Ntk_t *p,word *pConfigData,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  word *pwVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  word uTruth;
  Vec_Int_t Leaves;
  int pFaninLits [16];
  int pVarMap [1000];
  ulong local_1060;
  long local_1058;
  Ifn_Obj_t *local_1050;
  Gia_Man_t *local_1048;
  Vec_Int_t *local_1040;
  word local_1038;
  ulong local_1030;
  Vec_Int_t local_1028;
  uint local_1018 [15];
  uint auStack_fdc [1003];
  
  uVar22 = p->nInps;
  uVar5 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
  if (uVar22 + 1 < 2) {
    uVar5 = uVar22 + 1;
  }
  local_1040 = vCover;
  if ((999 < p->nParsVIni) || (iVar16 = vLeaves->nSize, (int)uVar22 < iVar16)) {
    __assert_fail("Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x2ed,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar11 = p->nObjs;
  iVar14 = p->nParsVIni - iVar11;
  iVar12 = uVar5 + 1;
  uVar5 = uVar22 * iVar12 + iVar14;
  local_1030 = (ulong)uVar5;
  local_1038 = pConfigData[(int)uVar5 >> 6];
  local_1048 = (Gia_Man_t *)pGia;
  if (0 < (int)uVar22) {
    uVar18 = 0;
    iVar15 = iVar14;
    do {
      iVar6 = 0;
      uVar5 = 0;
      do {
        uVar10 = 1 << ((byte)iVar6 & 0x1f);
        if ((pConfigData[iVar15 + iVar6 >> 6] >> ((ulong)(uint)(iVar15 + iVar6) & 0x3f) & 1) == 0) {
          uVar10 = 0;
        }
        uVar5 = uVar5 | uVar10;
        iVar6 = iVar6 + 1;
      } while (iVar12 != iVar6);
      if ((int)uVar5 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (iVar16 <= (int)(uVar5 >> 1)) {
        __assert_fail("Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2f3,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (vLeaves->pArray[uVar5 >> 1] < 0) goto LAB_0043d0eb;
      auStack_fdc[uVar18 + 1] = vLeaves->pArray[uVar5 >> 1] ^ uVar5 & 1;
      uVar18 = uVar18 + 1;
      iVar15 = iVar15 + iVar12;
    } while (uVar18 != uVar22);
  }
  iVar16 = 0;
  if ((int)uVar22 < iVar11) {
    local_1050 = p->Nodes;
    lVar19 = (long)(int)uVar22;
    piVar9 = p->Nodes[lVar19].Fanins;
    uVar18 = 0;
    do {
      uVar22 = *(uint *)(local_1050 + lVar19) >> 3 & 0x1f;
      if (6 < uVar22) {
        __assert_fail("nFans <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2fc,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      switch(*(uint *)(local_1050 + lVar19) & 7) {
      case 3:
        if (uVar22 == 0) {
          uVar5 = 1;
        }
        else {
          uVar5 = 1;
          uVar2 = 0;
          do {
            uVar5 = Gia_ManHashAnd((Gia_Man_t *)pGia,uVar5,auStack_fdc[(long)piVar9[uVar2] + 1]);
            uVar2 = uVar2 + 1;
          } while (uVar22 != uVar2);
        }
        goto LAB_0043d083;
      case 4:
        if (uVar22 == 0) {
          uVar5 = 0;
        }
        else {
          uVar2 = 0;
          uVar5 = 0;
          do {
            uVar5 = Gia_ManHashXor((Gia_Man_t *)pGia,uVar5,auStack_fdc[(long)piVar9[uVar2] + 1]);
            uVar2 = uVar2 + 1;
          } while (uVar22 != uVar2);
        }
LAB_0043d083:
        auStack_fdc[lVar19 + 1] = uVar5;
        break;
      case 5:
        if (uVar22 != 3) {
          __assert_fail("nFans == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x30d,
                        "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar22 = Gia_ManHashMux((Gia_Man_t *)pGia,
                                auStack_fdc[(long)local_1050[lVar19].Fanins[0] + 1],
                                auStack_fdc[(long)local_1050[lVar19].Fanins[1] + 1],
                                auStack_fdc[(long)local_1050[lVar19].Fanins[2] + 1]);
        auStack_fdc[lVar19 + 1] = uVar22;
        break;
      case 6:
        local_1060 = 0;
        uVar21 = 0;
        uVar2 = 0;
        do {
          uVar3 = (uVar18 & 0xffffffff) + uVar21;
          if ((pConfigData[(int)uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
            uVar2 = uVar2 | 1L << (uVar21 & 0x3f);
            local_1060 = uVar2;
          }
          uVar21 = uVar21 + 1;
        } while ((uint)uVar21 >> (sbyte)uVar22 == 0);
        uVar5 = uVar22;
        if (uVar22 < 3) {
          uVar5 = 3;
        }
        uVar10 = uVar5;
        if (uVar5 == 3) {
          uVar10 = 4;
        }
        uVar7 = uVar10;
        if (uVar10 == 4) {
          uVar7 = 5;
        }
        if (1 < uVar7 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar1 = (uint)uVar2;
        uVar13 = -(uVar1 & 1);
        if (uVar22 != 0) {
          uVar13 = uVar1;
        }
        uVar13 = (uVar13 & 3) * 5;
        if (1 < uVar22) {
          uVar13 = uVar1;
        }
        uVar3 = (ulong)((uVar13 & 0xf) << 4 | uVar13 & 0xf);
        if (2 < uVar22) {
          uVar3 = uVar2;
        }
        uVar2 = (ulong)(uint)((int)(uVar3 & 0xff) << 8) | uVar3 & 0xff;
        if (uVar5 != 3) {
          uVar2 = uVar3;
        }
        uVar3 = (ulong)(uint)((int)uVar2 << 0x10) | uVar2 & 0xffff;
        if (uVar10 != 4) {
          uVar3 = uVar2;
        }
        uVar2 = uVar3 << 0x20 | uVar3 & 0xffffffff;
        if (uVar7 != 5) {
          uVar2 = uVar3;
        }
        local_1060 = uVar2;
        if (uVar22 == 0) {
LAB_0043d069:
          auStack_fdc[lVar19 + 1] = (uint)uVar2 & 1;
        }
        else {
          uVar3 = 0;
          do {
            local_1018[uVar3] = auStack_fdc[(long)piVar9[uVar3] + 1];
            uVar3 = uVar3 + 1;
          } while (uVar22 != uVar3);
          if (uVar22 == 0) goto LAB_0043d069;
          uVar3 = 0;
          pwVar17 = s_Truths6Neg;
          lVar20 = 0x9bf208;
          uVar5 = 0;
          do {
            bVar4 = (byte)(1 << ((byte)uVar3 & 0x1f));
            if ((*pwVar17 & (uVar2 >> (bVar4 & 0x3f) ^ uVar2)) != 0) {
              lVar8 = (long)(int)uVar5;
              if ((lVar8 < (long)uVar3) && (local_1018[lVar8] = local_1018[uVar3], uVar3 != uVar5))
              {
                bVar4 = (char)(-1 << ((byte)uVar5 & 0x1f)) + bVar4;
                lVar8 = lVar8 * 0x90;
                uVar2 = (uVar2 & *(ulong *)(lVar20 + 8 + lVar8)) >> (bVar4 & 0x3f) |
                        (*(ulong *)(lVar20 + lVar8) & uVar2) << (bVar4 & 0x3f) |
                        *(ulong *)(lVar20 + -8 + lVar8) & uVar2;
                pGia = local_1048;
                local_1060 = uVar2;
              }
              uVar5 = uVar5 + 1;
            }
            uVar3 = uVar3 + 1;
            lVar20 = lVar20 + 0x18;
            pwVar17 = pwVar17 + 1;
          } while (uVar22 != uVar3);
          local_1058 = lVar19;
          if ((int)uVar22 < (int)uVar5) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
          }
          if (uVar5 == 0) goto LAB_0043d069;
          local_1028.pArray = (int *)local_1018;
          local_1028.nCap = uVar5;
          local_1028.nSize = uVar5;
          uVar22 = Kit_TruthToGia((Gia_Man_t *)pGia,(uint *)&local_1060,uVar5,local_1040,&local_1028
                                  ,1);
          auStack_fdc[local_1058 + 1] = uVar22;
          lVar19 = local_1058;
        }
        uVar18 = (uVar18 & 0xffffffff) + uVar21;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x328,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar16 = (int)uVar18;
      lVar19 = lVar19 + 1;
      iVar11 = p->nObjs;
      piVar9 = piVar9 + 0xc;
    } while (lVar19 < iVar11);
  }
  if (iVar16 != iVar14) {
    __assert_fail("iVar == nTtBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x32a,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (-1 < (int)auStack_fdc[iVar11]) {
    return auStack_fdc[iVar11] ^ (uint)((local_1038 >> (local_1030 & 0x3f) & 1) != 0);
  }
LAB_0043d0eb:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int If_ManSatDeriveGiaFromBits( void * pGia, Ifn_Ntk_t * p, word * pConfigData, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    Gia_Man_t * pNew = (Gia_Man_t *)pGia;
    int i, k, iLit, iVar = 0, nVarsNew, pVarMap[1000];
    int nTtBits = p->nParsVIni - p->nObjs;
    int nPermBits = Abc_Base2Log(p->nInps + 1) + 1;
    int fCompl = Abc_TtGetBit( pConfigData, nTtBits + nPermBits * p->nInps );
    assert( Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( iLit = k = 0; k < nPermBits; k++ )
            if ( Abc_TtGetBit(pConfigData, nTtBits + i * nPermBits + k) )
                iLit |= (1 << k);
        assert( Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves) );
        pVarMap[i] = Abc_Lit2LitL( Vec_IntArray(vLeaves), iLit );
    }
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        //int iFanin = p->Nodes[i].iFirst;
        assert( nFans <= 6 );
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int pFaninLits[16];
            // collect truth table
            word uTruth = 0;
            int nMints = (1 << nFans);
            for ( k = 0; k < nMints; k++ )
                if ( Abc_TtGetBit(pConfigData, iVar++) )
                    uTruth |= ((word)1 << k);
            uTruth = Abc_Tt6Stretch( uTruth, nFans );
            // collect function
            for ( k = 0; k < nFans; k++ )
                pFaninLits[k] = pVarMap[pFans[k]];
            // implement the function
            nVarsNew = Abc_TtMinBase( &uTruth, pFaninLits, nFans, 6 );
            if ( nVarsNew == 0 )
                pVarMap[i] = (int)(uTruth & 1);
            else
            {
                extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
                Vec_Int_t Leaves = { nVarsNew, nVarsNew, pFaninLits };
                pVarMap[i] = Kit_TruthToGia( pNew, (unsigned *)&uTruth, nVarsNew, vCover, &Leaves, 1 ); // hashing enabled!!!
            }
        }
        else assert( 0 );
    }
    assert( iVar == nTtBits );
    return Abc_LitNotCond( pVarMap[p->nObjs - 1], fCompl );
}